

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall TTD::TTEventList::Iterator::MoveNext(Iterator *this)

{
  TTEventListLink *pTVar1;
  EventLogEntry *pEVar2;
  ulong uVar3;
  
  pEVar2 = Current(this);
  uVar3 = this->m_currIdx + this->m_vtable[pEVar2->EventKind].DataSize;
  if (this->m_currLink->CurrPos <= uVar3) {
    pTVar1 = this->m_currLink->Next;
    this->m_currLink = pTVar1;
    if (pTVar1 == (TTEventListLink *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = pTVar1->StartPos;
    }
  }
  this->m_currIdx = uVar3;
  return;
}

Assistant:

void TTEventList::Iterator::MoveNext()
    {
        NSLogEvents::EventLogEntry* data = this->Current();
        size_t dataSize = this->m_vtable[(uint32)data->EventKind].DataSize;

        if(this->m_currIdx + dataSize < this->m_currLink->CurrPos)
        {
            this->m_currIdx += dataSize;
        }
        else
        {
            this->m_currLink = this->m_currLink->Next;
            this->m_currIdx = (this->m_currLink != nullptr) ? this->m_currLink->StartPos : 0;
        }
    }